

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::error
          (CAPIBuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  _func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *p_Var1;
  void *pvVar2;
  StringRef filename_local;
  string local_70;
  string local_50;
  
  filename_local.Length = filename.Length;
  filename_local.Data = filename.Data;
  p_Var1 = (this->cAPIDelegate).handle_diagnostic;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)
                0x0) {
    pvVar2 = (this->cAPIDelegate).context;
    llvm::StringRef::str_abi_cxx11_(&local_50,&filename_local);
    llvm::Twine::str_abi_cxx11_(&local_70,message);
    (*p_Var1)(pvVar2,llb_buildsystem_diagnostic_kind_error,local_50._M_dataplus._M_p,-1,-1,
              local_70._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,filename,at,message);
  return;
}

Assistant:

virtual void error(StringRef filename, const Token& at, const Twine& message) override {
    if (cAPIDelegate.handle_diagnostic) {
      cAPIDelegate.handle_diagnostic(cAPIDelegate.context,
                                     llb_buildsystem_diagnostic_kind_error,
                                     filename.str().c_str(),
                                     -1,
                                     -1,
                                     message.str().c_str());
    } else {
        BuildSystemFrontendDelegate::error(filename, at, message);
    }
  }